

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_list.h
# Opt level: O2

void __thiscall PackageList::freeze(PackageList *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->packages)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(p_Var2 + 2));
    poVar1 = std::operator<<(poVar1,"==");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 3));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void freeze(){
        for(auto&p:packages){
            std::cout << p.second.name << "==" << p.second.version << std::endl;
        }
	}